

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystemInvocation::parse
          (BuildSystemInvocation *this,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args,SourceMgr *sourceMgr)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  size_t __n;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  Twine local_4b0;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  Twine local_448;
  Twine local_430;
  char *local_418;
  char *end_1;
  void *local_400;
  ulong local_3f8;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  Twine local_360;
  char *local_348;
  char *end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  Twine local_300;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  int local_2d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  Twine local_290;
  undefined1 local_278 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> algorithm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  Twine local_218;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  Twine local_1b0;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Twine local_148;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  Twine local_e0;
  iterator local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end3;
  iterator __begin3;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *option;
  anon_class_16_2_f26e8178 error;
  SourceMgr *sourceMgr_local;
  BuildSystemInvocation *this_local;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args_local;
  int local_c;
  
  args_local.Data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.Length
  ;
  this_local = (BuildSystemInvocation *)args.Data;
  option = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sourceMgr;
  error.sourceMgr = (SourceMgr *)this;
  error.this = (BuildSystemInvocation *)sourceMgr;
LAB_001d1cb5:
  bVar1 = llvm::
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&this_local);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  local_98 = llvm::
             ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::front((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this_local);
  ___range3 = llvm::
              ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::slice((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&this_local,1);
  this_local = (BuildSystemInvocation *)__range3;
  args_local.Data = local_a0;
  bVar1 = std::operator==(local_98,"-");
  if (bVar1) {
    __begin3 = (iterator)&this_local;
    __end3 = llvm::
             ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)__begin3);
    arg = llvm::
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::end((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)__begin3);
    for (; __end3 != arg; __end3 = __end3 + 1) {
      local_c8 = __end3;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->positionalArgs,__end3);
    }
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_98), *pcVar3 != '-')) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->positionalArgs,local_98);
      goto LAB_001d1cb5;
    }
    bVar1 = std::operator==(local_98,"--help");
    if (bVar1) {
      this->showUsage = true;
      return;
    }
    bVar1 = std::operator==(local_98,"--version");
    if (bVar1) {
      this->showVersion = true;
      return;
    }
    bVar1 = std::operator==(local_98,"--no-db");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->dbPath,"");
      goto LAB_001d1cb5;
    }
    bVar1 = std::operator==(local_98,"--db");
    if (bVar1) {
      bVar1 = llvm::
              ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::empty((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&this_local);
      if (bVar1) {
        std::operator+(&local_120,"missing argument to \'",local_98);
        std::operator+(&local_100,&local_120,"\'");
        llvm::Twine::Twine(&local_e0,&local_100);
        parse::anon_class_16_2_f26e8178::operator()((anon_class_16_2_f26e8178 *)&option,&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        return;
      }
      pbVar5 = llvm::
               ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[]((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&this_local,0);
      std::__cxx11::string::operator=((string *)&this->dbPath,(string *)pbVar5);
      local_130 = llvm::
                  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::slice((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&this_local,1);
      this_local = (BuildSystemInvocation *)local_130.Data;
      args_local.Data =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130.Length;
      goto LAB_001d1cb5;
    }
    bVar1 = std::operator==(local_98,"-C");
    if ((bVar1) || (bVar1 = std::operator==(local_98,"--chdir"), bVar1)) {
      bVar1 = llvm::
              ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::empty((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&this_local);
      if (bVar1) {
        std::operator+(&local_188,"missing argument to \'",local_98);
        std::operator+(&local_168,&local_188,"\'");
        llvm::Twine::Twine(&local_148,&local_168);
        parse::anon_class_16_2_f26e8178::operator()((anon_class_16_2_f26e8178 *)&option,&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        return;
      }
      pbVar5 = llvm::
               ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[]((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&this_local,0);
      std::__cxx11::string::operator=((string *)&this->chdirPath,(string *)pbVar5);
      local_198 = llvm::
                  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::slice((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&this_local,1);
      this_local = (BuildSystemInvocation *)local_198.Data;
      args_local.Data =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198.Length;
      goto LAB_001d1cb5;
    }
    bVar1 = std::operator==(local_98,"-f");
    if (bVar1) {
      bVar1 = llvm::
              ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::empty((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&this_local);
      if (bVar1) {
        std::operator+(&local_1f0,"missing argument to \'",local_98);
        std::operator+(&local_1d0,&local_1f0,"\'");
        llvm::Twine::Twine(&local_1b0,&local_1d0);
        parse::anon_class_16_2_f26e8178::operator()((anon_class_16_2_f26e8178 *)&option,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        return;
      }
      pbVar5 = llvm::
               ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[]((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&this_local,0);
      std::__cxx11::string::operator=((string *)&this->buildFilePath,(string *)pbVar5);
      local_200 = llvm::
                  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::slice((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&this_local,1);
      this_local = (BuildSystemInvocation *)local_200.Data;
      args_local.Data =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200.Length;
      goto LAB_001d1cb5;
    }
    bVar1 = std::operator==(local_98,"--serial");
    if (bVar1) {
      this->useSerialBuild = true;
      goto LAB_001d1cb5;
    }
    bVar1 = std::operator==(local_98,"--scheduler");
    if (!bVar1) {
      bVar1 = std::operator==(local_98,"-j");
      if ((bVar1) || (bVar1 = std::operator==(local_98,"--jobs"), bVar1)) {
        bVar1 = llvm::
                ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::empty((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&this_local);
        if (bVar1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&end,
                         "missing argument to \'",local_98);
          std::operator+(&local_320,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&end,
                         "\'");
          llvm::Twine::Twine(&local_300,&local_320);
          parse::anon_class_16_2_f26e8178::operator()
                    ((anon_class_16_2_f26e8178 *)&option,&local_300);
          std::__cxx11::string::~string((string *)&local_320);
          std::__cxx11::string::~string((string *)&end);
          return;
        }
        llvm::
        ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator[]((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&this_local,0);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        lVar4 = strtol(pcVar3,&local_348,10);
        this->schedulerLanes = (uint32_t)lVar4;
        if (*local_348 != '\0') {
          pbVar5 = llvm::
                   ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator[]((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&this_local,0);
          std::operator+(&local_3e0,"invalid argument \'",pbVar5);
          std::operator+(&local_3c0,&local_3e0,"\' to \'");
          std::operator+(&local_3a0,&local_3c0,local_98);
          std::operator+(&local_380,&local_3a0,"\'");
          llvm::Twine::Twine(&local_360,&local_380);
          parse::anon_class_16_2_f26e8178::operator()
                    ((anon_class_16_2_f26e8178 *)&option,&local_360);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3e0);
        }
        local_3f0 = llvm::
                    ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::slice((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&this_local,1);
        this_local = (BuildSystemInvocation *)local_3f0.Data;
        args_local.Data =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0.Length;
      }
      else {
        local_400 = (void *)std::__cxx11::string::data();
        local_3f8 = std::__cxx11::string::length();
        args_local.Length = (size_type)anon_var_dwarf_14005e;
        end_1 = "-j";
        __n = strlen("-j");
        bVar1 = false;
        if (__n <= local_3f8) {
          if (__n == 0) {
            local_c = 0;
          }
          else {
            local_c = memcmp(local_400,end_1,__n);
          }
          bVar1 = local_c == 0;
        }
        if (bVar1) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_98);
          lVar4 = strtol(pcVar3,&local_418,10);
          this->schedulerLanes = (uint32_t)lVar4;
          if (*local_418 != '\0') {
            llvm::Twine::Twine(&local_430,"invalid argument to \'-j\'");
            parse::anon_class_16_2_f26e8178::operator()
                      ((anon_class_16_2_f26e8178 *)&option,&local_430);
          }
        }
        else {
          bVar1 = std::operator==(local_98,"-v");
          if ((bVar1) || (bVar1 = std::operator==(local_98,"--verbose"), bVar1)) {
            this->showVerboseStatus = true;
          }
          else {
            bVar1 = std::operator==(local_98,"--trace");
            if (!bVar1) {
              std::operator+(&local_4f0,"invalid option \'",local_98);
              std::operator+(&local_4d0,&local_4f0,"\'");
              llvm::Twine::Twine(&local_4b0,&local_4d0);
              parse::anon_class_16_2_f26e8178::operator()
                        ((anon_class_16_2_f26e8178 *)&option,&local_4b0);
              std::__cxx11::string::~string((string *)&local_4d0);
              std::__cxx11::string::~string((string *)&local_4f0);
              return;
            }
            bVar1 = llvm::
                    ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::empty((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&this_local);
            if (bVar1) {
              std::operator+(&local_488,"missing argument to \'",local_98);
              std::operator+(&local_468,&local_488,"\'");
              llvm::Twine::Twine(&local_448,&local_468);
              parse::anon_class_16_2_f26e8178::operator()
                        ((anon_class_16_2_f26e8178 *)&option,&local_448);
              std::__cxx11::string::~string((string *)&local_468);
              std::__cxx11::string::~string((string *)&local_488);
              return;
            }
            pbVar5 = llvm::
                     ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator[]((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&this_local,0);
            std::__cxx11::string::operator=((string *)&this->traceFilePath,(string *)pbVar5);
            local_498 = llvm::
                        ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::slice((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&this_local,1);
            this_local = (BuildSystemInvocation *)local_498.Data;
            args_local.Data =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_498.Length;
          }
        }
      }
      goto LAB_001d1cb5;
    }
    bVar1 = llvm::
            ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::empty((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&this_local);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&algorithm.field_2 + 8),"missing argument to \'",local_98);
      std::operator+(&local_238,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&algorithm.field_2 + 8),"\'");
      llvm::Twine::Twine(&local_218,&local_238);
      parse::anon_class_16_2_f26e8178::operator()((anon_class_16_2_f26e8178 *)&option,&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)(algorithm.field_2._M_local_buf + 8));
      return;
    }
    pbVar5 = llvm::
             ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[]((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&this_local,0);
    std::__cxx11::string::string((string *)local_278,(string *)pbVar5);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_278,"commandNamePriority");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_278,"default"), bVar1)) {
      this->schedulerAlgorithm = NamePriority;
LAB_001d2351:
      local_2e8 = llvm::
                  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::slice((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&this_local,1);
      this_local = (BuildSystemInvocation *)local_2e8.Data;
      args_local.Data =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8.Length;
      local_2d4 = 0;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_278,"fifo");
      if (bVar1) {
        this->schedulerAlgorithm = FIFO;
        goto LAB_001d2351;
      }
      std::operator+(&local_2d0,"unknown scheduler algorithm \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278)
      ;
      std::operator+(&local_2b0,&local_2d0,"\'");
      llvm::Twine::Twine(&local_290,&local_2b0);
      parse::anon_class_16_2_f26e8178::operator()((anon_class_16_2_f26e8178 *)&option,&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      local_2d4 = 3;
    }
    std::__cxx11::string::~string((string *)local_278);
    if (local_2d4 == 0) goto LAB_001d1cb5;
  }
  return;
}

Assistant:

void BuildSystemInvocation::parse(llvm::ArrayRef<std::string> args,
                                  llvm::SourceMgr& sourceMgr) {
  auto error = [&](const Twine &message) {
    sourceMgr.PrintMessage(llvm::SMLoc{}, llvm::SourceMgr::DK_Error, message);
    hadErrors = true;
  };

  while (!args.empty()) {
    const auto& option = args.front();
    args = args.slice(1);

    if (option == "-") {
      for (const auto& arg: args) {
        positionalArgs.push_back(arg);
      }
      break;
    }

    if (!option.empty() && option[0] != '-') {
      positionalArgs.push_back(option);
      continue;
    }
    
    if (option == "--help") {
      showUsage = true;
      break;
    } else if (option == "--version") {
      showVersion = true;
      break;
    } else if (option == "--no-db") {
      dbPath = "";
    } else if (option == "--db") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      dbPath = args[0];
      args = args.slice(1);
    } else if (option == "-C" || option == "--chdir") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      chdirPath = args[0];
      args = args.slice(1);
    } else if (option == "-f") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      buildFilePath = args[0];
      args = args.slice(1);
    } else if (option == "--serial") {
      useSerialBuild = true;
    } else if (option == "--scheduler") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      auto algorithm = args[0];
      if (algorithm == "commandNamePriority" || algorithm == "default") {
        schedulerAlgorithm = SchedulerAlgorithm::NamePriority;
      } else if (algorithm == "fifo") {
        schedulerAlgorithm = SchedulerAlgorithm::FIFO;
      } else {
        error("unknown scheduler algorithm '" + algorithm + "'");
        break;
      }
      args = args.slice(1);
    } else if (option == "-j" || option == "--jobs") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      char *end;
      schedulerLanes = ::strtol(args[0].c_str(), &end, 10);
      if (*end != '\0') {
        error("invalid argument '" + args[0] + "' to '" + option + "'");
      }
      args = args.slice(1);
    } else if (StringRef(option).startswith("-j")) {
      char *end;
      schedulerLanes = ::strtol(&option[2], &end, 10);
      if (*end != '\0') {
        error("invalid argument to '-j'");
      }
    } else if (option == "-v" || option == "--verbose") {
      showVerboseStatus = true;
    } else if (option == "--trace") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      traceFilePath = args[0];
      args = args.slice(1);
    } else {
      error("invalid option '" + option + "'");
      break;
    }
  }
}